

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_exec(Context *context,IntrinsicResult *partialResult)

{
  TextOutputMethod *pp_Var1;
  byte bVar2;
  IntrinsicResultStorage *pIVar3;
  long lVar4;
  ListStorage<MiniScript::TACLine> *pLVar5;
  bool bVar6;
  long *plVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  long *in_RDX;
  double dVar11;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *timeout;
  ValueList data;
  ValueDict result;
  String cmd;
  int status;
  String stdErr;
  String stdOut;
  Value local_128;
  undefined1 local_118 [8];
  long *local_110;
  undefined1 local_108 [8];
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_100;
  bool local_f8;
  anon_union_8_3_2f476f46_for_data local_f0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_e8;
  anon_union_8_3_2f476f46_for_data local_e0;
  bool local_d8;
  int local_cc;
  anon_union_8_3_2f476f46_for_data local_c8;
  anon_union_8_3_2f476f46_for_data local_c0;
  anon_union_8_3_2f476f46_for_data local_b8;
  anon_union_8_3_2f476f46_for_data local_b0;
  anon_union_8_3_2f476f46_for_data local_a8;
  anon_union_8_3_2f476f46_for_data local_a0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_98;
  IntrinsicResult local_90;
  List<MiniScript::Value> local_88;
  long *local_78;
  char local_70;
  long *local_68;
  char local_60;
  Value local_58;
  Value local_48;
  Value local_38;
  
  pIVar3 = partialResult[0xe].rs;
  dVar11 = *(double *)&pIVar3[3].result;
  local_90.rs = (IntrinsicResultStorage *)0x0;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    dVar11 = MiniScript::Machine::CurrentWallClockTime();
    local_90.rs = (IntrinsicResultStorage *)(dVar11 - *(double *)&pIVar3[3].result);
  }
  lVar4 = *in_RDX;
  if ((lVar4 == 0) || (*(char *)(lVar4 + 0x10) == '\x01')) {
    local_60 = '\0';
    plVar7 = (long *)operator_new(0x30);
    plVar7[1] = 1;
    *plVar7 = (long)&PTR__StringStorage_001d10b0;
    plVar7[3] = 4;
    plVar7[4] = -1;
    puVar8 = (undefined4 *)operator_new__(4);
    plVar7[2] = (long)puVar8;
    *puVar8 = 0;
    *puVar8 = 0x646d63;
    local_68 = plVar7;
    MiniScript::Context::GetVar
              ((Context *)local_118,(String *)partialResult,(LocalOnlyMode)&local_68);
    MiniScript::Value::ToString((Value *)&local_e0,(Machine *)local_118);
    if ((2 < local_118[0]) && (local_110 != (long *)0x0)) {
      plVar7 = local_110 + 1;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (**(code **)(*local_110 + 8))();
      }
      local_110 = (long *)0x0;
    }
    if ((local_68 != (long *)0x0) && (local_60 == '\0')) {
      plVar7 = local_68 + 1;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (**(code **)(*local_68 + 8))();
      }
      local_68 = (long *)0x0;
    }
    local_70 = '\0';
    plVar7 = (long *)operator_new(0x30);
    plVar7[1] = 1;
    *plVar7 = (long)&PTR__StringStorage_001d10b0;
    plVar7[3] = 8;
    plVar7[4] = -1;
    puVar9 = (undefined8 *)operator_new__(8);
    plVar7[2] = (long)puVar9;
    *puVar9 = 0;
    *puVar9 = 0x74756f656d6974;
    local_78 = plVar7;
    MiniScript::Context::GetVar
              ((Context *)local_108,(String *)partialResult,(LocalOnlyMode)&local_78);
    timeout = local_100;
    if (local_108[0] != 1) {
      timeout = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
    if ((2 < local_108[0]) &&
       (local_100 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
      plVar7 = &(local_100->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        local_98 = timeout;
        (*(local_100->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        timeout = local_98;
      }
      local_100 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
    if ((local_78 != (long *)0x0) && (local_70 == '\0')) {
      plVar7 = local_78 + 1;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        local_98 = timeout;
        (**(code **)(*local_78 + 8))();
        timeout = local_98;
      }
      local_78 = (long *)0x0;
    }
    local_118 = (undefined1  [8])0x0;
    local_110 = (long *)((ulong)local_110 & 0xffffffffffffff00);
    local_a0.tempNum._0_1_ = '\0';
    local_a8.number = local_e0.number;
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_e0.ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      (local_e0.ref)->refCount = (local_e0.ref)->refCount + 1;
    }
    bVar6 = MiniScript::BeginExec
                      ((String *)&local_a8,(double)timeout,(double)local_90.rs,
                       (ValueList *)local_118);
    if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_a8.ref !=
         (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_a0.tempNum._0_1_ == '\0')) {
      plVar7 = &(local_a8.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((RefCountedStorage *)&(local_a8.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage
          [1])();
      }
      local_a8.number = 0.0;
    }
    if (bVar6) {
      MiniScript::Value::Value(&local_38,(ValueList *)local_118);
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_38);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           0;
      if ((Temp < local_38.type) && (local_38.data.ref != (RefCountedStorage *)0x0)) {
        plVar7 = &(local_38.data.ref)->refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_38.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_38.data.number = 0.0;
      }
    }
    else {
      MiniScript::IntrinsicResult::ensureStorage
                ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
      pLVar5 = MiniScript::IntrinsicResult::Null;
      (context->code).ls = MiniScript::IntrinsicResult::Null;
      if (pLVar5 != (ListStorage<MiniScript::TACLine> *)0x0) {
        plVar7 = &(pLVar5->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + 1;
      }
    }
    if ((local_118 != (undefined1  [8])0x0) && (local_110._0_1_ == false)) {
      plVar7 = &((RefCountedStorage *)local_118)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((RefCountedStorage *)local_118)->_vptr_RefCountedStorage[1])();
        local_118 = (undefined1  [8])0x0;
      }
    }
    if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_e0.ref !=
         (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) && (local_d8 == false)) {
      plVar7 = &(local_e0.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((RefCountedStorage *)&(local_e0.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage
          [1])();
      }
    }
  }
  else {
    if (lVar4 == 0) {
      pbVar10 = &MiniScript::Value::null;
    }
    else {
      pbVar10 = (byte *)(lVar4 + 0x18);
    }
    bVar2 = *pbVar10;
    local_108 = *(undefined1 (*) [8])(pbVar10 + 8);
    if ((2 < bVar2) && (local_108 != (undefined1  [8])0x0)) {
      ((Interpreter *)local_108)->standardOutput = ((Interpreter *)local_108)->standardOutput + 1;
    }
    if (bVar2 != 4) {
      MiniScript::_Error("Assert failed: type == ValueType::List",
                         "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
                         ,0x94);
    }
    local_118 = local_108;
    local_110 = (long *)((ulong)local_110 & 0xffffffffffffff00);
    if (local_108 != (undefined1  [8])0x0) {
      *(TextOutputMethod *)((long)local_108 + 8) = *(TextOutputMethod *)((long)local_108 + 8) + 1;
    }
    if (2 < bVar2 && local_108 != (undefined1  [8])0x0) {
      pp_Var1 = (TextOutputMethod *)((long)local_108 + 8);
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*((RefCountedStorage *)local_108)->_vptr_RefCountedStorage[1])();
      }
      local_108 = (undefined1  [8])0x0;
    }
    local_b8.number = 0.0;
    local_b0.tempNum._0_1_ = '\0';
    local_c8.number = 0.0;
    local_c0.tempNum._0_1_ = '\0';
    local_cc = -1;
    MiniScript::List<MiniScript::Value>::List(&local_88,(List<MiniScript::Value> *)local_118);
    bVar6 = MiniScript::FinishExec
                      (&local_88,(double)local_90.rs,(String *)&local_b8,(String *)&local_c8,
                       &local_cc);
    if ((local_88.ls != (ListStorage<MiniScript::Value> *)0x0) && (local_88.isTemp == false)) {
      plVar7 = &((local_88.ls)->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((local_88.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        local_88.ls = (ListStorage<MiniScript::Value> *)0x0;
      }
    }
    if (bVar6) {
      local_108 = (undefined1  [8])&PTR__Dictionary_001d1238;
      local_100 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      local_f8 = false;
      MiniScript::Value::Value((Value *)&local_f0,"output");
      local_128.type = String;
      local_128.noInvoke = false;
      local_128.localOnly = Off;
      local_128.data = local_b8;
      if (local_b8.ref == (RefCountedStorage *)0x0) {
        local_128.data = DAT_001d3308;
      }
      if (local_128.data.ref != (RefCountedStorage *)0x0) {
        (local_128.data.ref)->refCount = (local_128.data.ref)->refCount + 1;
      }
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_108,(Value *)&local_f0,&local_128);
      if ((Temp < local_128.type) && (local_128.data.ref != (RefCountedStorage *)0x0)) {
        plVar7 = &(local_128.data.ref)->refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_128.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_128.data.number = 0.0;
      }
      if ((2 < (byte)local_f0.tempNum._0_1_) &&
         (local_e8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
        plVar7 = &(local_e8->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_e8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_e8 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      MiniScript::Value::Value((Value *)&local_f0,"errors");
      local_128.type = String;
      local_128.noInvoke = false;
      local_128.localOnly = Off;
      local_128.data = local_c8;
      if (local_c8.ref == (RefCountedStorage *)0x0) {
        local_128.data = DAT_001d3308;
      }
      if (local_128.data.ref != (RefCountedStorage *)0x0) {
        (local_128.data.ref)->refCount = (local_128.data.ref)->refCount + 1;
      }
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_108,(Value *)&local_f0,&local_128);
      if ((Temp < local_128.type) && (local_128.data.ref != (RefCountedStorage *)0x0)) {
        plVar7 = &(local_128.data.ref)->refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_128.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_128.data.number = 0.0;
      }
      if ((2 < (byte)local_f0.tempNum._0_1_) &&
         (local_e8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
        plVar7 = &(local_e8->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_e8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_e8 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      MiniScript::Value::Value((Value *)&local_f0,"status");
      local_128.data.number = (double)local_cc;
      local_128.type = Number;
      local_128.noInvoke = false;
      local_128.localOnly = Off;
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_108,(Value *)&local_f0,&local_128);
      if ((Temp < local_128.type) && (local_128.data.ref != (RefCountedStorage *)0x0)) {
        plVar7 = &(local_128.data.ref)->refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_128.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_128.data.number = 0.0;
      }
      if ((2 < (byte)local_f0.tempNum._0_1_) &&
         (local_e8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
        plVar7 = &(local_e8->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_e8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_e8 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      MiniScript::Value::Value(&local_48,(ValueDict *)local_108);
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_48);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_48.type) && (local_48.data.ref != (RefCountedStorage *)0x0)) {
        plVar7 = &(local_48.data.ref)->refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_48.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_48.data.number = 0.0;
      }
      local_108 = (undefined1  [8])&PTR__Dictionary_001d1238;
      if ((local_100 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         (local_f8 == false)) {
        plVar7 = &(local_100->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_100->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_100 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
    }
    else {
      MiniScript::Value::Value(&local_58,(ValueList *)local_118);
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_58);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           0;
      if ((Temp < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
        plVar7 = &(local_58.data.ref)->refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_58.data.number = 0.0;
      }
    }
    if ((local_c8.ref != (RefCountedStorage *)0x0) && (local_c0.tempNum._0_1_ == '\0')) {
      plVar7 = &(local_c8.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_c8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_c8.number = 0.0;
    }
    if ((local_b8.ref != (RefCountedStorage *)0x0) && (local_b0.tempNum._0_1_ == '\0')) {
      plVar7 = &(local_b8.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_b8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b8.number = 0.0;
    }
    if ((local_118 != (undefined1  [8])0x0) && (local_110._0_1_ == false)) {
      pp_Var1 = (TextOutputMethod *)((long)local_118 + 8);
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*((RefCountedStorage *)local_118)->_vptr_RefCountedStorage[1])();
      }
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exec(Context *context, IntrinsicResult partialResult) {
	double now = context->vm->RunTime();
	if (partialResult.Done()) {
		// This is the initial entry into `exec`.  Fork a subprocess to execute the
		// given command, and return a partial result we can use to check on its progress.
		String cmd = context->GetVar("cmd").ToString();
		double timeout = context->GetVar("timeout").DoubleValue();
		ValueList data;
		if (BeginExec(cmd, timeout, now, &data)) {
			return IntrinsicResult(data, false);
		}
		return IntrinsicResult::Null;
	}
	
	// This is a subsequent entry to intrinsic_exec, where we've already forked
	// the subprocess, and now we're waiting for it to finish.	al time out of the partial result.
	ValueList data = partialResult.Result().GetList();
	String stdOut, stdErr;
	int status = -1;
	if (FinishExec(data, now, &stdOut, &stdErr, &status)) {
		// All done!
		ValueDict result;
		result.SetValue("output", Value(stdOut));
		result.SetValue("errors", Value(stdErr));
		result.SetValue("status", Value(status));
		return IntrinsicResult(result);
	} else {
		// Not done yet.
		return IntrinsicResult(data, false);
	}
}